

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall sptk::Matrix::Matrix(Matrix *this,int num_row,int num_column)

{
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar1;
  reference ppdVar2;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  int local_34;
  int local_20;
  
  *in_RDI = &PTR__Matrix_00126d28;
  local_34 = in_ESI;
  if (in_ESI < 0) {
    local_34 = 0;
  }
  *(int *)(in_RDI + 1) = local_34;
  this_00 = (vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xc);
  if (in_EDX < 0) {
    in_EDX = 0;
  }
  *(int *)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start = in_EDX;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x117bd7);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            ((vector<double_*,_std::allocator<double_*>_> *)0x117bea);
  std::vector<double,_std::allocator<double>_>::resize
            (this_00,CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
  std::vector<double_*,_std::allocator<double_*>_>::resize
            ((vector<double_*,_std::allocator<double_*>_> *)this_00,
             CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 1); local_20 = local_20 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),
                        (long)(local_20 * *(int *)((long)in_RDI + 0xc)));
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 5),(long)local_20)
    ;
    *ppdVar2 = pvVar1;
  }
  return;
}

Assistant:

Matrix::Matrix(int num_row, int num_column)
    : num_row_(num_row < 0 ? 0 : num_row),
      num_column_(num_column < 0 ? 0 : num_column) {
  data_.resize(num_row_ * num_column_);
  index_.resize(num_row_);

  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}